

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O0

int aes_test_alignment_detection(uint n)

{
  long lVar1;
  long lVar2;
  uint8_t *qh;
  uint8_t *qf;
  int local_30;
  uint32_t count_neq;
  uint32_t count_eq;
  uint32_t i;
  uint8_t p [16];
  uint local_c;
  uint n_local;
  
  local_30 = 0;
  qf._4_4_ = 0;
  if ((n < 4) || (0x10 < n)) {
    local_c = 1;
  }
  else {
    for (count_neq = 0; count_neq < n; count_neq = count_neq + 1) {
      lVar1 = (long)&count_eq +
              ((ulong)count_neq - ((long)&count_eq + (ulong)count_neq & (ulong)(n - 1)));
      lVar2 = (long)&count_eq +
              (-((long)&count_eq + (ulong)count_neq) & (ulong)(n - 1)) + (ulong)count_neq;
      if (lVar2 == lVar1) {
        local_30 = local_30 + 1;
      }
      else {
        if (lVar2 != lVar1 + (ulong)n) {
          return 1;
        }
        qf._4_4_ = qf._4_4_ + 1;
      }
    }
    local_c = (uint)(local_30 != 1 || qf._4_4_ != n - 1);
  }
  return local_c;
}

Assistant:

AES_RETURN aes_test_alignment_detection(unsigned int n)	/* 4 <= n <= 16 */
{	uint8_t	p[16];
    uint32_t i, count_eq = 0, count_neq = 0;

    if(n < 4 || n > 16)
        return EXIT_FAILURE;

    for(i = 0; i < n; ++i)
    {
        uint8_t *qf = ALIGN_FLOOR(p + i, n),
                *qh =  ALIGN_CEIL(p + i, n);
        
        if(qh == qf)
            ++count_eq;
        else if(qh == qf + n)
            ++count_neq;
        else
            return EXIT_FAILURE;
    }
    return (count_eq != 1 || count_neq != n - 1 ? EXIT_FAILURE : EXIT_SUCCESS);
}